

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RenameTokenRemap(Parse *pParse,void *pTo,void *pFrom)

{
  RenameToken *p;
  void *pFrom_local;
  void *pTo_local;
  Parse *pParse_local;
  
  p = pParse->pRename;
  while( true ) {
    if (p == (RenameToken *)0x0) {
      return;
    }
    if (p->p == pFrom) break;
    p = p->pNext;
  }
  p->p = pTo;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RenameTokenRemap(Parse *pParse, const void *pTo, const void *pFrom){
  RenameToken *p;
  renameTokenCheckAll(pParse, pTo);
  for(p=pParse->pRename; p; p=p->pNext){
    if( p->p==pFrom ){
      p->p = pTo;
      break;
    }
  }
}